

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_resume(lua_State *L,int nargs)

{
  int iVar1;
  GCstr *pGVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  
  if ((L->cframe == (void *)0x0) && (L->status < 2)) {
    pTVar3 = L->top;
    pTVar5 = pTVar3 + -(long)nargs;
    if (L->status == 0) {
      L->top = pTVar3 + 1;
      pTVar4 = pTVar3;
      if (0 < nargs) {
        do {
          pTVar3 = pTVar4 + -1;
          *pTVar4 = pTVar4[-1];
          pTVar4 = pTVar3;
        } while (pTVar5 < pTVar3);
      }
      pTVar3->u64 = 0xffffffffffffffff;
      pTVar5 = pTVar3 + 1;
    }
    iVar1 = lj_vm_resume(L,pTVar5,0,0);
    return iVar1;
  }
  pTVar3 = L->base;
  L->top = pTVar3;
  pGVar2 = lj_err_str(L,LJ_ERR_COSUSP);
  pTVar3->u64 = (ulong)pGVar2 | 0xfffd800000000000;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar3 + 1) {
    lj_state_growstack1(L);
  }
  return 2;
}

Assistant:

LUA_API int lua_resume(lua_State *L, int nargs)
{
  if (L->cframe == NULL && L->status <= LUA_YIELD)
    return lj_vm_resume(L,
      L->status == LUA_OK ? api_call_base(L, nargs) : L->top - nargs,
      0, 0);
  L->top = L->base;
  setstrV(L, L->top, lj_err_str(L, LJ_ERR_COSUSP));
  incr_top(L);
  return LUA_ERRRUN;
}